

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O0

uint32_t __thiscall SQASTWritingVisitor::writeString(SQASTWritingVisitor *this,SQChar *s)

{
  bool bVar1;
  size_type_conflict sVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  long in_RDI;
  uint idx;
  iterator it;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  size_type_conflict v;
  ArenaVector<const_char_*> *in_stack_ffffffffffffffc0;
  OutputStream *this_00;
  _Node_iterator_base<std::pair<const_char_*const,_unsigned_int>,_true> local_28;
  _Node_iterator_base<std::pair<const_char_*const,_unsigned_int>,_true> local_20 [3];
  size_type_conflict local_4;
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
       ::find((unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),(key_type *)0x140066)
  ;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
       ::end((unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
              *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  bVar1 = std::__detail::operator!=(local_20,&local_28);
  if (bVar1) {
    this_00 = *(OutputStream **)(in_RDI + 8);
    std::__detail::_Node_iterator<std::pair<const_char_*const,_unsigned_int>,_false,_true>::
    operator->((_Node_iterator<std::pair<const_char_*const,_unsigned_int>,_false,_true> *)0x1400ab);
    OutputStream::writeUInt32(this_00,in_stack_ffffffffffffffbc);
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_char_*const,_unsigned_int>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_char_*const,_unsigned_int>,_false,_true> *
                          )0x1400c2);
    local_4 = ppVar3->second;
  }
  else {
    sVar2 = ArenaVector<const_char_*>::size(*(ArenaVector<const_char_*> **)(in_RDI + 0x10));
    ArenaVector<const_char_*>::push_back
              (in_stack_ffffffffffffffc0,
               (char **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    v = sVar2;
    pmVar4 = std::
             unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
             ::operator[]((unordered_map<const_char_*,_unsigned_int,_SQASTWritingVisitor::str_hash,_SQASTWritingVisitor::eq_str,_StdArenaAllocator<std::pair<const_char_*const,_unsigned_int>_>_>
                           *)in_stack_ffffffffffffffc0,
                          (key_type *)CONCAT44(sVar2,in_stack_ffffffffffffffb8));
    *pmVar4 = v;
    OutputStream::writeUInt32((OutputStream *)in_stack_ffffffffffffffc0,v);
    local_4 = sVar2;
  }
  return local_4;
}

Assistant:

uint32_t SQASTWritingVisitor::writeString(const SQChar *s) {
  auto it = stringTable.find(s);

  if (it != stringTable.end()) {
    stream->writeUInt32(it->second);
    return it->second;
  }

  unsigned idx = stringIndexes.size();
  stringIndexes.push_back(s);
  stringTable[s] = idx;

  stream->writeUInt32(idx);
  return idx;
}